

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-options.c
# Opt level: O1

int udp_options_test(sockaddr *addr)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  ulong uVar8;
  undefined1 *puVar9;
  int iVar10;
  ushort *puVar11;
  undefined1 *puVar12;
  undefined1 *puVar13;
  undefined1 *puVar14;
  undefined1 *puVar15;
  undefined1 *puVar16;
  undefined1 *puVar17;
  long lVar18;
  bool bVar19;
  uv_udp_t h;
  undefined1 auStack_2f8 [216];
  undefined1 auStack_220 [216];
  code *pcStack_148;
  int iStack_134;
  sockaddr asStack_130 [2];
  code *pcStack_110;
  undefined1 local_100 [216];
  
  pcStack_110 = (code *)0x189e1f;
  uVar6 = uv_default_loop();
  pcStack_110 = (code *)0x189e2f;
  iVar2 = uv_udp_init(uVar6,local_100);
  if (iVar2 != 0) goto LAB_00189fdb;
  pcStack_110 = (code *)0x189e44;
  uv_unref(local_100);
  pcStack_110 = (code *)0x189e51;
  iVar2 = uv_udp_bind(local_100,addr,0);
  if (iVar2 != 0) goto LAB_00189fe0;
  iVar10 = 1;
  pcStack_110 = (code *)0x189e70;
  iVar2 = uv_udp_set_broadcast(local_100,1);
  pcStack_110 = (code *)0x189e80;
  iVar3 = uv_udp_set_broadcast(local_100,1);
  pcStack_110 = (code *)0x189e90;
  iVar4 = uv_udp_set_broadcast(local_100,0);
  pcStack_110 = (code *)0x189ea0;
  iVar5 = uv_udp_set_broadcast(local_100,0);
  if (iVar5 != 0 || (iVar4 != 0 || (iVar3 != 0 || iVar2 != 0))) goto LAB_00189fe5;
  do {
    pcStack_110 = (code *)0x189eb8;
    iVar2 = uv_udp_set_ttl(local_100,iVar10);
    if (iVar2 != 0) {
      pcStack_110 = (code *)0x189fd1;
      udp_options_test_cold_4();
      goto LAB_00189fd1;
    }
    iVar10 = iVar10 + 1;
  } while (iVar10 != 0x100);
  lVar18 = 0;
  do {
    pcStack_110 = (code *)0x189ee5;
    iVar2 = uv_udp_set_ttl(local_100,*(undefined4 *)((long)udp_options_test::invalid_ttls + lVar18))
    ;
    if (iVar2 != -0x16) goto LAB_00189fd1;
    lVar18 = lVar18 + 4;
  } while (lVar18 != 0xc);
  pcStack_110 = (code *)0x189f0a;
  iVar2 = uv_udp_set_multicast_loop(local_100,1);
  pcStack_110 = (code *)0x189f19;
  iVar3 = uv_udp_set_multicast_loop(local_100,1);
  iVar10 = 0;
  pcStack_110 = (code *)0x189f2b;
  iVar4 = uv_udp_set_multicast_loop(local_100,0);
  pcStack_110 = (code *)0x189f3b;
  iVar5 = uv_udp_set_multicast_loop(local_100,0);
  if (iVar5 != 0 || (iVar4 != 0 || (iVar3 != 0 || iVar2 != 0))) goto LAB_00189fea;
  do {
    pcStack_110 = (code *)0x189f53;
    iVar2 = uv_udp_set_multicast_ttl(local_100,iVar10);
    if (iVar2 != 0) goto LAB_00189fd6;
    iVar10 = iVar10 + 1;
  } while (iVar10 != 0x100);
  pcStack_110 = (code *)0x189f70;
  iVar2 = uv_udp_set_multicast_ttl(local_100,0x100);
  if (iVar2 != -0x16) goto LAB_00189fef;
  pcStack_110 = (code *)0x189f7f;
  iVar2 = uv_run(uVar6,0);
  if (iVar2 != 0) goto LAB_00189ff4;
  pcStack_110 = (code *)0x189f88;
  uVar6 = uv_default_loop();
  pcStack_110 = (code *)0x189f9c;
  uv_walk(uVar6,close_walk_cb,0);
  pcStack_110 = (code *)0x189fa6;
  uv_run(uVar6,0);
  pcStack_110 = (code *)0x189fab;
  uVar7 = uv_default_loop();
  pcStack_110 = (code *)0x189fb3;
  iVar2 = uv_loop_close(uVar7);
  if (iVar2 == 0) {
    pcStack_110 = (code *)0x189fbc;
    iVar2 = uv_library_shutdown();
    return iVar2;
  }
  goto LAB_00189ff9;
LAB_00189fd1:
  pcStack_110 = (code *)0x189fd6;
  udp_options_test_cold_5();
LAB_00189fd6:
  pcStack_110 = (code *)0x189fdb;
  udp_options_test_cold_7();
LAB_00189fdb:
  pcStack_110 = (code *)0x189fe0;
  udp_options_test_cold_1();
LAB_00189fe0:
  pcStack_110 = (code *)0x189fe5;
  udp_options_test_cold_2();
LAB_00189fe5:
  pcStack_110 = (code *)0x189fea;
  udp_options_test_cold_3();
LAB_00189fea:
  pcStack_110 = (code *)0x189fef;
  udp_options_test_cold_6();
LAB_00189fef:
  pcStack_110 = (code *)0x189ff4;
  udp_options_test_cold_8();
LAB_00189ff4:
  pcStack_110 = (code *)0x189ff9;
  udp_options_test_cold_9();
LAB_00189ff9:
  pcStack_110 = run_test_udp_options6;
  udp_options_test_cold_10();
  pcStack_148 = (code *)0x18a012;
  pcStack_110 = (code *)uVar6;
  iVar2 = uv_interface_addresses(asStack_130,&iStack_134);
  if (iVar2 != 0) {
LAB_0018a088:
    pcStack_148 = (code *)0x18a08d;
    run_test_udp_options6_cold_1();
    return 1;
  }
  if ((long)iStack_134 < 1) {
    pcStack_148 = (code *)0x18a088;
    uv_free_interface_addresses();
    goto LAB_0018a088;
  }
  puVar11 = (ushort *)(asStack_130[0]._0_8_ + 0x14);
  uVar8 = 1;
  do {
    uVar1 = *puVar11;
    if (uVar1 == 10) break;
    puVar11 = puVar11 + 0x28;
    bVar19 = uVar8 < (ulong)(long)iStack_134;
    uVar8 = uVar8 + 1;
  } while (bVar19);
  pcStack_148 = (code *)0x18a051;
  uv_free_interface_addresses(asStack_130[0]._0_8_);
  if (uVar1 != 10) goto LAB_0018a088;
  pcStack_148 = (code *)0x18a06d;
  iVar2 = uv_ip6_addr("::",0x23a3,asStack_130);
  if (iVar2 == 0) {
    pcStack_148 = (code *)0x18a07b;
    udp_options_test(asStack_130);
    return 0;
  }
  pcStack_148 = run_test_udp_no_autobind;
  run_test_udp_options6_cold_2();
  puVar13 = auStack_2f8;
  puVar16 = auStack_2f8;
  puVar14 = auStack_2f8;
  puVar17 = auStack_2f8;
  puVar15 = auStack_2f8;
  pcStack_148 = (code *)(ulong)uVar1;
  puVar9 = (undefined1 *)uv_default_loop();
  puVar12 = puVar9;
  iVar2 = uv_udp_init(puVar9,auStack_220);
  if (iVar2 == 0) {
    puVar12 = auStack_220;
    iVar2 = uv_udp_set_multicast_ttl(puVar12,0x20);
    if (iVar2 != -9) goto LAB_0018a241;
    puVar12 = auStack_220;
    iVar2 = uv_udp_set_broadcast(puVar12,1);
    if (iVar2 != -9) goto LAB_0018a246;
    puVar12 = auStack_220;
    iVar2 = uv_udp_set_ttl(puVar12,1);
    if (iVar2 != -9) goto LAB_0018a24b;
    puVar12 = auStack_220;
    iVar2 = uv_udp_set_multicast_loop(puVar12,1);
    if (iVar2 != -9) goto LAB_0018a250;
    puVar12 = auStack_220;
    iVar2 = uv_udp_set_multicast_interface(puVar12,"0.0.0.0");
    if (iVar2 != -9) goto LAB_0018a255;
    uv_close(auStack_220,0);
    puVar12 = puVar9;
    iVar2 = uv_udp_init_ex(puVar9,auStack_2f8,0x102);
    if (iVar2 != 0) goto LAB_0018a25a;
    iVar2 = uv_udp_set_multicast_ttl(auStack_2f8,0x20);
    puVar12 = puVar13;
    if (iVar2 != 0) goto LAB_0018a25f;
    iVar2 = uv_udp_set_broadcast(auStack_2f8,1);
    if (iVar2 != 0) goto LAB_0018a264;
    iVar2 = uv_udp_set_ttl(auStack_2f8,1);
    puVar16 = puVar14;
    if (iVar2 != 0) goto LAB_0018a269;
    iVar2 = uv_udp_set_multicast_loop(auStack_2f8,1);
    if (iVar2 != 0) goto LAB_0018a26e;
    iVar2 = uv_udp_set_multicast_interface(auStack_2f8,"0.0.0.0");
    puVar17 = puVar15;
    if (iVar2 != 0) goto LAB_0018a273;
    uv_close(auStack_2f8,0);
    iVar2 = uv_run(puVar9,0);
    if (iVar2 == 0) {
      uVar6 = uv_default_loop();
      uv_walk(uVar6,close_walk_cb,0);
      uv_run(uVar6,0);
      puVar9 = (undefined1 *)uv_default_loop();
      iVar2 = uv_loop_close(puVar9);
      if (iVar2 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_0018a27d;
    }
  }
  else {
    run_test_udp_no_autobind_cold_1();
LAB_0018a241:
    run_test_udp_no_autobind_cold_2();
LAB_0018a246:
    run_test_udp_no_autobind_cold_3();
LAB_0018a24b:
    run_test_udp_no_autobind_cold_4();
LAB_0018a250:
    run_test_udp_no_autobind_cold_5();
LAB_0018a255:
    run_test_udp_no_autobind_cold_6();
LAB_0018a25a:
    run_test_udp_no_autobind_cold_7();
LAB_0018a25f:
    puVar16 = puVar12;
    run_test_udp_no_autobind_cold_8();
LAB_0018a264:
    run_test_udp_no_autobind_cold_9();
LAB_0018a269:
    puVar17 = puVar16;
    run_test_udp_no_autobind_cold_10();
LAB_0018a26e:
    run_test_udp_no_autobind_cold_11();
LAB_0018a273:
    puVar9 = puVar17;
    run_test_udp_no_autobind_cold_12();
  }
  run_test_udp_no_autobind_cold_13();
LAB_0018a27d:
  run_test_udp_no_autobind_cold_14();
  iVar2 = uv_is_closing();
  if (iVar2 == 0) {
    iVar2 = uv_close(puVar9,0);
    return iVar2;
  }
  return iVar2;
}

Assistant:

static int udp_options_test(const struct sockaddr* addr) {
  static int invalid_ttls[] = { -1, 0, 256 };
  uv_loop_t* loop;
  uv_udp_t h;
  int i, r;

  loop = uv_default_loop();

  r = uv_udp_init(loop, &h);
  ASSERT(r == 0);

  uv_unref((uv_handle_t*)&h); /* don't keep the loop alive */

  r = uv_udp_bind(&h, addr, 0);
  ASSERT(r == 0);

  r = uv_udp_set_broadcast(&h, 1);
  r |= uv_udp_set_broadcast(&h, 1);
  r |= uv_udp_set_broadcast(&h, 0);
  r |= uv_udp_set_broadcast(&h, 0);
  ASSERT(r == 0);

  /* values 1-255 should work */
  for (i = 1; i <= 255; i++) {
    r = uv_udp_set_ttl(&h, i);
#if defined(__MVS__)
    if (addr->sa_family == AF_INET6)
      ASSERT(r == 0);
    else
      ASSERT(r == UV_ENOTSUP);
#else
    ASSERT(r == 0);
#endif
  }

  for (i = 0; i < (int) ARRAY_SIZE(invalid_ttls); i++) {
    r = uv_udp_set_ttl(&h, invalid_ttls[i]);
    ASSERT(r == UV_EINVAL);
  }

  r = uv_udp_set_multicast_loop(&h, 1);
  r |= uv_udp_set_multicast_loop(&h, 1);
  r |= uv_udp_set_multicast_loop(&h, 0);
  r |= uv_udp_set_multicast_loop(&h, 0);
  ASSERT(r == 0);

  /* values 0-255 should work */
  for (i = 0; i <= 255; i++) {
    r = uv_udp_set_multicast_ttl(&h, i);
    ASSERT(r == 0);
  }

  /* anything >255 should fail */
  r = uv_udp_set_multicast_ttl(&h, 256);
  ASSERT(r == UV_EINVAL);
  /* don't test ttl=-1, it's a valid value on some platforms */

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(r == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}